

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadRegion.cpp
# Opt level: O0

set<const_llvm::Instruction_*,_std::less<const_llvm::Instruction_*>,_std::allocator<const_llvm::Instruction_*>_>
* __thiscall ThreadRegion::llvmInstructions(ThreadRegion *this)

{
  bool bVar1;
  reference ppNVar2;
  Instruction *this_00;
  long in_RSI;
  set<const_llvm::Instruction_*,_std::less<const_llvm::Instruction_*>,_std::allocator<const_llvm::Instruction_*>_>
  *in_RDI;
  pair<std::_Rb_tree_const_iterator<const_llvm::Instruction_*>,_bool> pVar3;
  Node **node;
  iterator __end1;
  iterator __begin1;
  set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *__range1;
  set<const_llvm::Instruction_*,_std::less<const_llvm::Instruction_*>,_std::allocator<const_llvm::Instruction_*>_>
  *llvmValues;
  set<const_llvm::Instruction_*,_std::less<const_llvm::Instruction_*>,_std::allocator<const_llvm::Instruction_*>_>
  *this_01;
  undefined1 in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffb9;
  _Self local_30;
  _Self local_28;
  long local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this_01 = in_RDI;
  std::
  set<const_llvm::Instruction_*,_std::less<const_llvm::Instruction_*>,_std::allocator<const_llvm::Instruction_*>_>
  ::set((set<const_llvm::Instruction_*,_std::less<const_llvm::Instruction_*>,_std::allocator<const_llvm::Instruction_*>_>
         *)0x1b45ee);
  local_20 = in_RSI + 0x10;
  local_28._M_node =
       (_Base_ptr)
       std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::begin
                 ((set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)in_RDI);
  local_30._M_node =
       (_Base_ptr)
       std::set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_>::end
                 ((set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)in_RDI);
  while (bVar1 = std::operator!=(&local_28,&local_30), bVar1) {
    ppNVar2 = std::_Rb_tree_const_iterator<Node_*>::operator*
                        ((_Rb_tree_const_iterator<Node_*> *)0x1b4639);
    bVar1 = Node::isArtificial(*ppNVar2);
    if (!bVar1) {
      this_00 = Node::llvmInstruction(*ppNVar2);
      pVar3 = std::
              set<const_llvm::Instruction_*,_std::less<const_llvm::Instruction_*>,_std::allocator<const_llvm::Instruction_*>_>
              ::insert((set<const_llvm::Instruction_*,_std::less<const_llvm::Instruction_*>,_std::allocator<const_llvm::Instruction_*>_>
                        *)this_00,
                       (value_type *)CONCAT71(in_stack_ffffffffffffffb9,in_stack_ffffffffffffffb8));
      in_stack_ffffffffffffffb8 = pVar3.second;
    }
    std::_Rb_tree_const_iterator<Node_*>::operator++((_Rb_tree_const_iterator<Node_*> *)this_01);
  }
  return this_01;
}

Assistant:

std::set<const llvm::Instruction *> ThreadRegion::llvmInstructions() const {
    std::set<const llvm::Instruction *> llvmValues;
    for (const auto &node : nodes_) {
        if (!node->isArtificial()) {
            llvmValues.insert(node->llvmInstruction());
        }
    }
    return llvmValues;
}